

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_urlencode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  ushort **ppuVar4;
  int nLen_00;
  char *pcVar5;
  jx9_value *pjVar6;
  char *zString;
  long lVar7;
  uchar zHex [3];
  int nLen;
  char local_46 [4];
  char local_42 [2];
  ushort **local_40;
  int local_34;
  
  if (0 < nArg) {
    pcVar3 = jx9_value_to_string(*apArg,&local_34);
    if (0 < (long)local_34) {
      local_46[2] = '\0';
      local_46[0] = '%';
      local_46[1] = '\0';
      ppuVar4 = __ctype_b_loc();
      pcVar5 = pcVar3;
      do {
        zString = pcVar5;
        lVar7 = 0;
        while ((bVar1 = zString[lVar7], ((*ppuVar4)[bVar1] & 8) != 0 ||
               ((bVar1 - 0x24 < 0x3c &&
                ((0x800000000000601U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0))))) {
          lVar2 = lVar7 + 1;
          lVar7 = lVar7 + 1;
          if (pcVar3 + local_34 <= zString + lVar2) {
            pcVar3 = zString + lVar7;
            goto LAB_0013602a;
          }
        }
        local_40 = ppuVar4;
        if (lVar7 != 0) {
          jx9_value_string(pCtx->pRet,zString,(int)lVar7);
        }
        if (bVar1 == 0x20) {
          local_42[0] = '+';
          pjVar6 = pCtx->pRet;
          pcVar5 = local_42;
          nLen_00 = 1;
        }
        else {
          local_46[1] = "0123456789ABCDEF"[bVar1 >> 4];
          local_46[2] = "0123456789ABCDEF"[bVar1 & 0xf];
          pjVar6 = pCtx->pRet;
          pcVar5 = local_46;
          nLen_00 = 3;
        }
        jx9_value_string(pjVar6,pcVar5,nLen_00);
        ppuVar4 = local_40;
        pcVar5 = zString + lVar7 + 1;
      } while (zString + lVar7 + 1 < pcVar3 + local_34);
      zString = zString + lVar7 + 1;
      pcVar3 = zString;
LAB_0013602a:
      if (pcVar3 == zString) {
        return 0;
      }
      jx9_value_string(pCtx->pRet,zString,(int)pcVar3 - (int)zString);
      return 0;
    }
  }
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).rVal = 0.0;
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_urlencode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the URL encoding */
	SyUriEncode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}